

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::SetProperty(cmMakefile *this,string *prop,char *value)

{
  cmStateDirectory local_58;
  undefined1 local_30 [8];
  cmListFileBacktrace lfbt;
  char *value_local;
  string *prop_local;
  cmMakefile *this_local;
  
  lfbt.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  GetBacktrace((cmMakefile *)local_30);
  cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
  cmStateDirectory::SetProperty
            (&local_58,prop,
             (char *)lfbt.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi,(cmListFileBacktrace *)local_30);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_30);
  return;
}

Assistant:

void cmMakefile::SetProperty(const std::string& prop, const char* value)
{
  cmListFileBacktrace lfbt = this->GetBacktrace();
  this->StateSnapshot.GetDirectory().SetProperty(prop, value, lfbt);
}